

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O1

BindingMap * __thiscall r_exec::BindingMap::get_atom_variable(BindingMap *this,Atom *a)

{
  atomic_int_fast64_t *paVar1;
  long *plVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  AtomValue *this_00;
  undefined4 *in_RDX;
  ulong uVar6;
  bool bVar7;
  undefined4 local_48;
  undefined4 local_44;
  BindingMap *local_40;
  P<r_exec::Value> local_38;
  
  lVar5 = *(long *)(a + 0x10);
  bVar7 = *(long *)(a + 0x18) != lVar5;
  local_40 = this;
  if (bVar7) {
    uVar6 = 0;
    do {
      plVar2 = *(long **)(lVar5 + uVar6 * 8);
      local_44 = *in_RDX;
      cVar4 = (**(code **)(*plVar2 + 0x60))(plVar2,(Atom *)&local_44);
      r_code::Atom::~Atom((Atom *)&local_44);
      if (cVar4 != '\0') {
        r_code::Atom::VLPointer((ushort)local_40,(ushort)uVar6);
        if (bVar7) {
          return local_40;
        }
        break;
      }
      uVar6 = uVar6 + 1;
      lVar5 = *(long *)(a + 0x10);
      bVar7 = uVar6 < (ulong)(*(long *)(a + 0x18) - lVar5 >> 3);
    } while (bVar7);
  }
  lVar5 = *(long *)(a + 0x18);
  lVar3 = *(long *)(a + 0x10);
  this_00 = (AtomValue *)operator_new(0x20);
  local_48 = *in_RDX;
  AtomValue::AtomValue(this_00,(BindingMap *)a,(Atom *)&local_48);
  LOCK();
  paVar1 = &(this_00->super_BoundValue).super_Value.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_38.object = (_Object *)this_00;
  std::vector<core::P<r_exec::Value>,std::allocator<core::P<r_exec::Value>>>::
  emplace_back<core::P<r_exec::Value>>
            ((vector<core::P<r_exec::Value>,std::allocator<core::P<r_exec::Value>>> *)(a + 0x10),
             &local_38);
  if ((AtomValue *)local_38.object != (AtomValue *)0x0) {
    LOCK();
    ((local_38.object)->refCount).super___atomic_base<long>._M_i =
         ((local_38.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_38.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(((BoundValue *)&(local_38.object)->_vptr__Object)->super_Value).super__Object._vptr__Object
        [1])();
    }
  }
  r_code::Atom::~Atom((Atom *)&local_48);
  r_code::Atom::VLPointer((ushort)local_40,(ushort)((ulong)(lVar5 - lVar3) >> 3));
  return local_40;
}

Assistant:

Atom BindingMap::get_atom_variable(Atom a)
{
    for (uint64_t i = 0; i < map.size(); ++i) {
        if (map[i]->contains(a)) {
            return Atom::VLPointer(i);
        }
    }

    uint64_t size = map.size();
    map.push_back(new AtomValue(this, a));
    return Atom::VLPointer(size);
}